

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O2

void __thiscall List<String>::clear(List<String> *this)

{
  Item *this_00;
  Iterator *pIVar1;
  
  pIVar1 = &this->_begin;
  while (this_00 = pIVar1->item, this_00 != &this->endItem) {
    String::~String(&this_00->value);
    this_00->prev = this->freeItem;
    this->freeItem = this_00;
    pIVar1 = (Iterator *)&this_00->next;
  }
  (this->_begin).item = &this->endItem;
  (this->endItem).prev = (Item *)0x0;
  this->_size = 0;
  return;
}

Assistant:

void clear()
  {
    for(Item* i = _begin.item, * end = &endItem; i != end; i = i->next)
    {
      i->~Item();
      i->prev = freeItem;
      freeItem = i;
    }
    _begin.item = &endItem;
    endItem.prev = 0;
    _size = 0;
  }